

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O1

bool __thiscall spvtools::opt::MemPass::IsLiveVar(MemPass *this,uint32_t varId)

{
  IRContext *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar4 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,varId);
  if (pIVar4->opcode_ == OpVariable) {
    uVar3 = 0;
    if (pIVar4->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar4,0);
    }
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    pIVar4 = analysis::DefUseManager::GetDef
                       ((pIVar1->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar3);
    uVar3 = (pIVar4->has_result_id_ & 1) + 1;
    if (pIVar4->has_type_id_ == false) {
      uVar3 = (uint)pIVar4->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(pIVar4,uVar3);
    if (uVar3 == 7) {
      bVar2 = HasLoads(this,varId);
      return bVar2;
    }
  }
  return true;
}

Assistant:

bool MemPass::IsLiveVar(uint32_t varId) const {
  const Instruction* varInst = get_def_use_mgr()->GetDef(varId);
  // assume live if not a variable eg. function parameter
  if (varInst->opcode() != spv::Op::OpVariable) return true;
  // non-function scope vars are live
  const uint32_t varTypeId = varInst->type_id();
  const Instruction* varTypeInst = get_def_use_mgr()->GetDef(varTypeId);
  if (spv::StorageClass(varTypeInst->GetSingleWordInOperand(
          kTypePointerStorageClassInIdx)) != spv::StorageClass::Function)
    return true;
  // test if variable is loaded from
  return HasLoads(varId);
}